

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceTriangleTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner,int outer0,int outer1,
          int outer2)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_00000014;
  int iVar3;
  int iVar4;
  long lVar5;
  Vec3 *a;
  float fVar6;
  Vec3 corners [3];
  int local_ac;
  _Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_a8;
  float local_88;
  int local_84;
  float local_80;
  int local_7c;
  int local_78;
  float local_74;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_70;
  ulong local_68;
  ulong local_60;
  tcu local_54 [12];
  tcu local_48 [12];
  tcu local_3c [12];
  
  local_68 = CONCAT44(in_register_00000014,inner);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (inner == 1) {
    if (outer2 != 1 || (outer1 != 1 || outer0 != 1)) {
      generateReferenceTriangleTessCoords
                (__return_storage_ptr__,spacingMode,spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2,
                 outer0,outer1,outer2);
      goto LAB_007203d5;
    }
    corners[0].m_data[0] = 1.0;
    corners[0].m_data[1] = 0.0;
    corners[0].m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
               corners);
    corners[0].m_data[0] = 0.0;
    corners[0].m_data[1] = 1.0;
    corners[0].m_data[2] = 0.0;
    local_70 = __return_storage_ptr__;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
               corners);
    corners[0].m_data[0] = 0.0;
    corners[0].m_data[1] = 0.0;
    corners[0].m_data[2] = 1.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
               corners);
  }
  else {
    fVar6 = (float)outer0;
    iVar3 = 0;
    if (outer0 < 1) {
      outer0 = 0;
    }
    local_70 = __return_storage_ptr__;
    for (; outer0 != iVar3; iVar3 = iVar3 + 1) {
      corners[0].m_data[2] = 1.0 - (float)iVar3 / fVar6;
      corners[0].m_data._0_8_ = (ulong)(uint)((float)iVar3 / fVar6) << 0x20;
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                 corners);
    }
    iVar4 = 0;
    iVar3 = outer1;
    if (outer1 < 1) {
      iVar3 = iVar4;
    }
    for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
      corners[0].m_data[2] = (float)iVar4 / (float)outer1;
      corners[0].m_data[1] = 0.0;
      corners[0].m_data[0] = 1.0 - corners[0].m_data[2];
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                 corners);
    }
    iVar4 = 0;
    iVar3 = outer2;
    if (outer2 < 1) {
      iVar3 = iVar4;
    }
    for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
      corners[0].m_data[1] = 1.0 - (float)iVar4 / (float)outer2;
      corners[0].m_data[0] = (float)iVar4 / (float)outer2;
      corners[0].m_data[2] = 0.0;
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                 corners);
    }
    local_ac = (int)local_68;
    local_88 = (float)(local_ac * 3);
    local_84 = (int)((long)((ulong)(uint)(local_ac >> 0x1f) << 0x20 | local_68 & 0xffffffff) / 2);
    local_60 = 0;
    if (local_84 < 1) {
      local_84 = 0;
    }
    while( true ) {
      local_ac = local_ac + -2;
      local_7c = 0;
      if (0 < local_ac) {
        local_7c = local_ac;
      }
      iVar3 = (int)local_60;
      if (iVar3 == local_84) break;
      local_60 = (ulong)(iVar3 + 1);
      iVar4 = iVar3 * 2 + 2;
      iVar3 = (int)local_68 - iVar4;
      if (iVar3 == 0) {
        tcu::Vector<float,_3>::Vector(corners,0.33333334);
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                   corners);
      }
      else {
        corners[0].m_data[2] = (float)iVar4 / local_88;
        corners[1].m_data[1] = 1.0 - (corners[0].m_data[2] + corners[0].m_data[2]);
        corners[0].m_data[1] = corners[0].m_data[2];
        corners[0].m_data[0] = corners[1].m_data[1];
        local_80 = (float)iVar3;
        iVar3 = 0;
        corners[1].m_data[0] = corners[0].m_data[2];
        corners[1].m_data[2] = corners[0].m_data[2];
        corners[2].m_data[0] = corners[0].m_data[2];
        corners[2].m_data[1] = corners[0].m_data[2];
        corners[2].m_data[2] = corners[1].m_data[1];
        while (iVar3 != local_7c) {
          local_74 = (float)iVar3 / local_80;
          fVar6 = 1.0 - local_74;
          a = corners;
          lVar5 = -3;
          local_78 = iVar3;
          while (lVar5 != 0) {
            tcu::operator*(local_48,fVar6,a);
            lVar1 = lVar5 + 4;
            lVar5 = lVar5 + 1;
            lVar2 = 0;
            if (lVar5 != 0) {
              lVar2 = lVar1;
            }
            tcu::operator*(local_54,local_74,corners + lVar2);
            tcu::operator+(local_3c,(Vector<float,_3> *)local_48,(Vector<float,_3> *)local_54);
            std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
            emplace_back<tcu::Vector<float,3>>
                      ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                       &local_a8,(Vector<float,_3> *)local_3c);
            a = a + 1;
          }
          iVar3 = local_78 + 1;
        }
      }
    }
  }
  (local_70->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
  (local_70->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
  (local_70->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__ = local_70;
LAB_007203d5:
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceTriangleTessCoords (const SpacingMode	spacingMode,
															const int			inner,
															const int			outer0,
															const int			outer1,
															const int			outer2)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner == 1)
	{
		if (outer0 == 1 && outer1 == 1 && outer2 == 1)
		{
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 1.0f));
			return tessCoords;
		}
		else
			return generateReferenceTriangleTessCoords(spacingMode, spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
													   outer0, outer1, outer2);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 1.0f - v)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f,        v)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(       v, 1.0f - v,     0.0f)); }

		const int numInnerTriangles = inner/2;
		for (int innerTriangleNdx = 0; innerTriangleNdx < numInnerTriangles; innerTriangleNdx++)
		{
			const int curInnerTriangleLevel = inner - 2*(innerTriangleNdx+1);

			if (curInnerTriangleLevel == 0)
				tessCoords.push_back(tcu::Vec3(1.0f/3.0f));
			else
			{
				const float		minUVW		= (float)(2 * (innerTriangleNdx + 1)) / (float)(3 * inner);
				const float		maxUVW		= 1.0f - 2.0f*minUVW;
				const tcu::Vec3	corners[3]	=
				{
					tcu::Vec3(maxUVW, minUVW, minUVW),
					tcu::Vec3(minUVW, maxUVW, minUVW),
					tcu::Vec3(minUVW, minUVW, maxUVW)
				};

				for (int i = 0; i < curInnerTriangleLevel; i++)
				{
					const float f = (float)i / (float)curInnerTriangleLevel;
					for (int j = 0; j < 3; j++)
						tessCoords.push_back((1.0f - f)*corners[j] + f*corners[(j+1)%3]);
				}
			}
		}

		return tessCoords;
	}
}